

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_upscale::build_graph(test_upscale *this,ggml_context *ctx)

{
  undefined8 uVar1;
  ggml_tensor *pgVar2;
  
  uVar1 = ggml_new_tensor(ctx,this->type,4,&this->ne);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar1,"a");
  if (this->transpose == true) {
    uVar1 = ggml_transpose(ctx,uVar1);
    ggml_set_name(uVar1,"a_transposed");
  }
  pgVar2 = (ggml_tensor *)ggml_upscale(ctx,uVar1,this->scale_factor,this->mode);
  ggml_set_name(pgVar2,"out");
  return pgVar2;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(a, "a");

        if (transpose) {
            a = ggml_transpose(ctx, a);
            ggml_set_name(a, "a_transposed");
        }

        ggml_tensor * out = ggml_upscale(ctx, a, scale_factor, mode);
        ggml_set_name(out, "out");

        return out;
    }